

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

intMatrix * __thiscall Image::getBinaryMatrix(intMatrix *__return_storage_ptr__,Image *this)

{
  pointer pvVar1;
  int i;
  long lVar2;
  int in_R8D;
  int j;
  long lVar3;
  undefined4 uVar4;
  allocator_type local_a1;
  _Vector_base<int,_std::allocator<int>_> local_a0;
  Mat tmp_gray_img;
  int local_80;
  int local_7c;
  long local_78;
  long *local_40;
  _InputArray local_28;
  
  cv::Mat::Mat(&tmp_gray_img,&this->content);
  local_a0._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28.sz.width = 0;
  local_28.sz.height = 0;
  local_a0._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x1010000;
  local_28.flags = 0x2010000;
  local_a0._M_impl.super__Vector_impl_data._M_finish = (pointer)&tmp_gray_img;
  local_28.obj = &tmp_gray_img;
  cv::cvtColor((cv *)&local_a0,&local_28,(_OutputArray *)0x6,0,in_R8D);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_a0,(long)local_7c,
             (allocator_type *)&local_28);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(__return_storage_ptr__,(long)local_80,(value_type *)&local_a0,&local_a1);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_a0);
  for (lVar2 = 0; lVar2 < local_80; lVar2 = lVar2 + 1) {
    pvVar1 = (__return_storage_ptr__->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    for (lVar3 = 0; lVar3 < local_7c; lVar3 = lVar3 + 1) {
      uVar4 = 0;
      if (0x96 < *(byte *)(lVar3 + *local_40 * lVar2 + local_78)) {
        uVar4 = 0xff;
      }
      *(undefined4 *)
       (*(long *)&pvVar1[lVar2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data + lVar3 * 4) = uVar4;
    }
  }
  cv::Mat::~Mat(&tmp_gray_img);
  return __return_storage_ptr__;
}

Assistant:

intMatrix Image::getBinaryMatrix(){
    cv::Mat tmp_gray_img = content;
    cv::cvtColor(tmp_gray_img, tmp_gray_img, cv::COLOR_BGR2GRAY);
    intMatrix binary_matrix(tmp_gray_img.rows, std::vector<int>(tmp_gray_img.cols));
    for(int i = 0; i<tmp_gray_img.rows;++i){
        for(int j=0; j<tmp_gray_img.cols;++j){
            binary_matrix[i][j] = (tmp_gray_img.at<uchar>(i, j) > THRESHOLD) ? ON : OFF;
        }
    }
    return binary_matrix;
}